

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWriter.cpp
# Opt level: O1

void __thiscall
internalJSONNode::WriteChildren(internalJSONNode *this,uint indent,json_string *output)

{
  uint uVar1;
  JSONNode **ppJVar2;
  json_string *pjVar3;
  uint amount;
  ulong uVar4;
  long lVar5;
  json_string indent_plus_one;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  json_string local_50;
  
  if (this->Children->mysize != 0) {
    local_90 = local_80;
    local_88 = 0;
    local_80[0] = 0;
    if (indent == 0xffffffff) {
      amount = 0xffffffff;
    }
    else {
      pjVar3 = jsonSingletonNEW_LINE::getValue_abi_cxx11_();
      amount = indent + 1;
      makeIndent_abi_cxx11_(&local_50,amount);
      std::operator+(&local_70,pjVar3,&local_50);
      std::__cxx11::string::operator=((string *)&local_90,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    uVar1 = this->Children->mysize;
    if (uVar1 != 0) {
      ppJVar2 = this->Children->array;
      lVar5 = (ulong)uVar1 << 3;
      uVar4 = 0;
      do {
        std::__cxx11::string::_M_append((char *)output,(ulong)local_90);
        Write(ppJVar2[uVar4]->internal,amount,this->_type == '\x04',output);
        if (uVar4 < uVar1 - 1) {
          std::__cxx11::string::push_back((char)output);
        }
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + -8;
      } while (lVar5 != 0);
    }
    if (amount != 0xffffffff) {
      pjVar3 = jsonSingletonNEW_LINE::getValue_abi_cxx11_();
      std::__cxx11::string::_M_append((char *)output,(ulong)(pjVar3->_M_dataplus)._M_p);
      makeIndent_abi_cxx11_(&local_70,amount - 1);
      std::__cxx11::string::_M_append((char *)output,(ulong)local_70._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
  }
  return;
}

Assistant:

void internalJSONNode::WriteChildren(unsigned int indent, json_string & output) const json_nothrow {
    //Iterate through the children and write them
    if (json_likely(CHILDREN -> empty())) return;

    json_string indent_plus_one;
    //handle whether or not it's formatted JSON
    if (indent != 0xFFFFFFFF){  //it's formatted, make the indentation strings
	   indent_plus_one = json_global(NEW_LINE) + makeIndent(++indent);
    }

    //else it's not formatted, leave the indentation strings empty
    const size_t size_minus_one = CHILDREN -> size() - 1;
    size_t i = 0;
    JSONNode ** it = CHILDREN -> begin();
    for(JSONNode ** it_end = CHILDREN -> end(); it != it_end; ++it, ++i){

		output += indent_plus_one;
		(*it) -> internal -> Write(indent, type() == JSON_ARRAY, output);
	    if (json_likely(i < size_minus_one)) output += JSON_TEXT(',');  //the last one does not get a comma, but all of the others do
    }
    if (indent != 0xFFFFFFFF){
		output += json_global(NEW_LINE);
		output += makeIndent(indent - 1);
    }
}